

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.c
# Opt level: O0

void codec_bench_dec(buffers *b,bufsize *bs,char *name,uint flags)

{
  float fVar1;
  int local_58;
  int local_54;
  int j;
  int i;
  base64_timespec end;
  base64_timespec start;
  float fastest;
  float timediff;
  uint flags_local;
  char *name_local;
  bufsize *bs_local;
  buffers *b_local;
  
  start.tv_nsec._4_4_ = -1.0;
  b->encsz = bs->len;
  for (local_54 = bs->repeat; local_54 != 0; local_54 = local_54 + -1) {
    base64_gettime((base64_timespec *)&end.tv_nsec);
    for (local_58 = bs->batch; local_58 != 0; local_58 = local_58 + -1) {
      base64_decode(b->enc,b->encsz,b->reg,&b->regsz,flags);
    }
    base64_gettime((base64_timespec *)&j);
    fVar1 = timediff_sec((base64_timespec *)&end.tv_nsec,(base64_timespec *)&j);
    fVar1 = fVar1 / (float)bs->batch;
    if ((start.tv_nsec._4_4_ < 0.0) || (fVar1 < start.tv_nsec._4_4_)) {
      start.tv_nsec._4_4_ = fVar1;
    }
  }
  fVar1 = bytes_to_mb(b->encsz);
  printf("%s\tdecode\t%.02f MB/sec\n",(double)(fVar1 / start.tv_nsec._4_4_),name);
  return;
}

Assistant:

static void
codec_bench_dec (struct buffers *b, const struct bufsize *bs, const char *name, unsigned int flags)
{
	float timediff, fastest = -1.0f;
	base64_timespec start, end;

	// Reset buffer size:
	b->encsz = bs->len;

	// Repeat benchmark a number of times for a fair test:
	for (int i = bs->repeat; i; i--) {

		// Timing loop, use batches to increase timer resolution:
		base64_gettime(&start);
		for (int j = bs->batch; j; j--)
			base64_decode(b->enc, b->encsz, b->reg, &b->regsz, flags);
		base64_gettime(&end);

		// Calculate average time of batch:
		timediff = timediff_sec(&start, &end) / bs->batch;

		// Update fastest time seen:
		if (fastest < 0.0f || timediff < fastest)
			fastest = timediff;
	}

	printf("%s\tdecode\t%.02f MB/sec\n", name, bytes_to_mb(b->encsz) / fastest);
}